

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O1

bool __thiscall ON_LineCurve::ChangeDimension(ON_LineCurve *this,int desired_dimension)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if (((desired_dimension & 0xfffffffeU) != 2) || (this->m_dim == desired_dimension))
  goto LAB_004cfd30;
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  if (desired_dimension == 2) {
    dVar1 = (this->m_line).from.x;
    if ((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) {
      (this->m_line).from.z = 0.0;
    }
    dVar1 = (this->m_line).to.x;
    iVar4 = 2;
    lVar5 = 0x38;
    iVar3 = 2;
    if ((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) {
LAB_004cfd25:
      iVar4 = iVar3;
      *(undefined8 *)
       ((long)&(((ON_LineCurve *)(&this->m_t + -4))->super_ON_Curve).super_ON_Geometry.
               super_ON_Object._vptr_ON_Object + lVar5) = 0;
    }
  }
  else {
    iVar4 = 3;
    if (this->m_dim == 2) {
      dVar1 = (this->m_line).from.x;
      if ((((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
          (dVar2 = (this->m_line).from.z, dVar2 == -1.23432101234321e+308)) && (!NAN(dVar2))) {
        (this->m_line).from.z = 0.0;
      }
      if ((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) {
        dVar1 = (this->m_line).to.z;
        lVar5 = 0x20;
        if ((dVar1 == -1.23432101234321e+308) && (iVar3 = 3, !NAN(dVar1))) goto LAB_004cfd25;
      }
    }
  }
  this->m_dim = iVar4;
LAB_004cfd30:
  return (desired_dimension & 0xfffffffeU) == 2;
}

Assistant:

bool ON_LineCurve::ChangeDimension( int desired_dimension )
{
  bool rc = (desired_dimension>=2 && desired_dimension<=3);

  if (rc && m_dim != desired_dimension )
  {
    DestroyCurveTree();
    if ( desired_dimension == 2 )
    {
      // 7 April 2003 Dale Lear - zero z coords if x coord are set
      if( ON_UNSET_VALUE != m_line.from.x )
        m_line.from.z = 0.0;
      if( ON_UNSET_VALUE != m_line.to.x )
        m_line.to.z = 0.0;
      m_dim = 2;
    }
    else
    {
      if ( 2 == m_dim  )
      {
        // 7 April 2003 Dale Lear
        // zero z coords if x coords are set and z coords are not set
        if( ON_UNSET_VALUE != m_line.from.x && ON_UNSET_VALUE == m_line.from.z )
          m_line.from.z = 0.0;
        if( ON_UNSET_VALUE != m_line.from.x && ON_UNSET_VALUE == m_line.to.z )
          m_line.from.z = 0.0;
      }
      m_dim = 3;
    }
  }

  return rc;
}